

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O3

uint Gia_Iso2ManCone_rec(Gia_Man_t *p,int Id,int Level)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int local_34;
  
  uVar8 = (ulong)(uint)Id;
  local_34 = 0;
  do {
    iVar6 = 0;
    if (Level == 0) {
LAB_006cabbf:
      uVar9 = 0;
LAB_006cabc2:
      return iVar6 + uVar9 + local_34;
    }
    while( true ) {
      iVar7 = (int)uVar8;
      if (p->nTravIdsAlloc <= iVar7) {
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x22c,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
      }
      if (p->pTravIds[iVar7] == p->nTravIds) goto LAB_006cabbf;
      p->pTravIds[iVar7] = p->nTravIds;
      if (iVar7 < 0) goto LAB_006cabf6;
      uVar2 = p->nObjs;
      if ((int)uVar2 <= iVar7) goto LAB_006cabf6;
      pGVar4 = p->pObjs;
      pGVar1 = pGVar4 + uVar8;
      uVar8 = *(ulong *)pGVar1;
      uVar5 = (uint)uVar8;
      if (((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) break;
      uVar9 = 0;
      uVar2 = pGVar1->Value;
      uVar5 = Gia_Iso2ManCone_rec(p,iVar7 - (uVar5 & 0x1fffffff),Level + -1);
      uVar8 = (ulong)(iVar7 - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff));
      iVar6 = iVar6 + uVar2 + uVar5;
      Level = Level + -1;
      if (Level == 0) goto LAB_006cabc2;
    }
    if ((~uVar5 & 0x9fffffff) != 0) {
      if ((~uVar8 & 0x1fffffff1fffffff) != 0) {
        __assert_fail("Gia_ObjIsConst0(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIso2.c"
                      ,0xbb,"unsigned int Gia_Iso2ManCone_rec(Gia_Man_t *, int, int)");
      }
      uVar9 = pGVar1->Value;
      goto LAB_006cabc2;
    }
    uVar5 = (uint)(uVar8 >> 0x20) & 0x1fffffff;
    iVar7 = p->vCis->nSize;
    uVar9 = pGVar1->Value;
    if ((int)uVar5 < iVar7 - p->nRegs) goto LAB_006cabc2;
    iVar3 = p->vCos->nSize;
    uVar5 = (iVar3 - iVar7) + uVar5;
    if (((int)uVar5 < 0) || (iVar3 <= (int)uVar5)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar5 = p->vCos->pArray[uVar5];
    if (((long)(int)uVar5 < 0) || (uVar2 <= uVar5)) {
LAB_006cabf6:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar1 = pGVar4 + (int)uVar5 + -(ulong)((uint)*(undefined8 *)(pGVar4 + (int)uVar5) & 0x1fffffff)
    ;
    if ((pGVar1 < pGVar4) || (pGVar4 + uVar2 <= pGVar1)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar8 = (ulong)(uint)((int)((ulong)((long)pGVar1 - (long)pGVar4) >> 2) * -0x55555555);
    local_34 = local_34 + uVar9 + iVar6;
  } while( true );
}

Assistant:

unsigned Gia_Iso2ManCone_rec( Gia_Man_t * p, int Id, int Level )
{
    Gia_Obj_t * pObj;
    if ( Level == 0 )
        return 0;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return 0;
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsAnd(pObj) )
        return pObj->Value + Gia_Iso2ManCone_rec( p, Gia_ObjFaninId0(pObj, Id), Level-1 ) + Gia_Iso2ManCone_rec( p, Gia_ObjFaninId1(pObj, Id), Level-1 );
    if ( Gia_ObjIsPi(p, pObj) )
        return pObj->Value;
    if ( Gia_ObjIsRo(p, pObj) )
        return pObj->Value + Gia_Iso2ManCone_rec( p, Gia_ObjId(p, Gia_ObjFanin0(Gia_ObjRoToRi(p, pObj))), Level );
    assert( Gia_ObjIsConst0(pObj) );
    return pObj->Value;
}